

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.cpp
# Opt level: O3

void duckdb::Bit::Finalize(bitstring_t *str)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  
  uVar2 = (str->value).pointer.length;
  pcVar5 = (str->value).pointer.prefix;
  pcVar3 = pcVar5;
  if (0xc < uVar2) {
    pcVar3 = (str->value).pointer.ptr;
  }
  bVar1 = *pcVar3;
  if ((ulong)bVar1 != 0) {
    uVar4 = 0;
    do {
      pcVar3 = pcVar5;
      if (0xc < (str->value).pointer.length) {
        pcVar3 = (str->value).pointer.ptr;
      }
      pcVar3[(uVar4 >> 3) + 1] = pcVar3[(uVar4 >> 3) + 1] | '\x01' << (~(byte)uVar4 & 7);
      uVar4 = uVar4 + 1;
    } while (bVar1 != uVar4);
    uVar2 = (str->value).pointer.length;
  }
  if (uVar2 < 0xd) {
    switchD_00569a20::default(pcVar5 + uVar2,0,0xc - (ulong)uVar2);
    return;
  }
  *(undefined4 *)((long)&str->value + 4) = *(undefined4 *)(str->value).pointer.ptr;
  return;
}

Assistant:

void Bit::Finalize(bitstring_t &str) {
	// bit strings require all padding bits to be set to 1
	// this method sets all padding bits to 1
	auto padding = GetBitPadding(str);
	for (idx_t i = 0; i < idx_t(padding); i++) {
		Bit::SetBitInternal(str, i, 1);
	}
	str.Finalize();
	Bit::Verify(str);
}